

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribe_options.h
# Opt level: O3

void __thiscall
miniros::SubscribeOptions::init<std_msgs::Empty_<std::allocator<void>>>
          (SubscribeOptions *this,string *_topic,uint32_t _queue_size,
          function<void_(const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&)>
          *_callback,
          function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>_>_>_()> *factory_fn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>
  *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_39;
  SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>
  *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  std::__cxx11::string::_M_assign((string *)this);
  this->queue_size = _queue_size;
  std::__cxx11::string::_M_replace
            ((ulong)&this->md5sum,0,(char *)(this->md5sum)._M_string_length,0x159d01);
  std::__cxx11::string::_M_replace
            ((ulong)&this->datatype,0,(char *)(this->datatype)._M_string_length,0x159d22);
  local_38 = (SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>
              *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::SubscriptionCallbackHelperT<std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>const&,void>,std::allocator<miniros::SubscriptionCallbackHelperT<std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>const&,void>>,std::function<void(std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>const&)>const&,std::function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>>>()>const&>
            (&_Stack_30,&local_38,
             (allocator<miniros::SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>_>
              *)&local_39,_callback,factory_fn);
  _Var2._M_pi = _Stack_30._M_pi;
  pSVar1 = local_38;
  local_38 = (SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>
              *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->helper).
            super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->helper).super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &pSVar1->super_SubscriptionCallbackHelper;
  (this->helper).super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  return;
}

Assistant:

void init(const std::string& _topic, uint32_t _queue_size,
       const std::function<void (const std::shared_ptr<M const>&)>& _callback,
       const std::function<std::shared_ptr<M>(void)>& factory_fn = DefaultMessageCreator<M>())
  {
    typedef typename ParameterAdapter<M>::Message MessageType;
    topic = _topic;
    queue_size = _queue_size;
    md5sum = message_traits::md5sum<MessageType>();
    datatype = message_traits::datatype<MessageType>();
    helper = std::make_shared<SubscriptionCallbackHelperT<const std::shared_ptr<MessageType const>&> >(_callback, factory_fn);
  }